

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  xmlNodePtr node_00;
  byte *value;
  bool bVar1;
  int digit;
  xmlAttrPtr attr;
  byte *pbStack_48;
  int ret;
  xmlChar *cur;
  xmlChar *val;
  char *expected_local;
  int def_local;
  int max_local;
  int min_local;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  attr._4_4_ = 0;
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"minOccurs");
  ctxt_local._4_4_ = def;
  if (node_00 != (xmlNodePtr)0x0) {
    value = xmlSchemaGetNodeContent(ctxt,node_00);
    pbStack_48 = value;
    while( true ) {
      bVar1 = true;
      if ((*pbStack_48 != 0x20) && ((*pbStack_48 < 9 || (bVar1 = true, 10 < *pbStack_48)))) {
        bVar1 = *pbStack_48 == 0xd;
      }
      if (!bVar1) break;
      pbStack_48 = pbStack_48 + 1;
    }
    if (*pbStack_48 == 0) {
      xmlSchemaPSimpleTypeErr
                (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,node_00,
                 (xmlSchemaTypePtr)0x0,expected,value,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      while( true ) {
        bVar1 = false;
        if (0x2f < *pbStack_48) {
          bVar1 = *pbStack_48 < 0x3a;
        }
        if (!bVar1) break;
        if (attr._4_4_ < 0xccccccd) {
          if ((int)(0x7fffffff - (*pbStack_48 - 0x30)) < attr._4_4_ * 10) {
            attr._4_4_ = 0x7fffffff;
          }
          else {
            attr._4_4_ = (*pbStack_48 - 0x30) + attr._4_4_ * 10;
          }
        }
        else {
          attr._4_4_ = 0x7fffffff;
        }
        pbStack_48 = pbStack_48 + 1;
      }
      while( true ) {
        bVar1 = true;
        if ((*pbStack_48 != 0x20) && ((*pbStack_48 < 9 || (bVar1 = true, 10 < *pbStack_48)))) {
          bVar1 = *pbStack_48 == 0xd;
        }
        if (!bVar1) break;
        pbStack_48 = pbStack_48 + 1;
      }
      if (((*pbStack_48 == 0) && (min <= attr._4_4_)) && ((max == -1 || (attr._4_4_ <= max)))) {
        ctxt_local._4_4_ = attr._4_4_;
      }
      else {
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,node_00,
                   (xmlSchemaTypePtr)0x0,expected,value,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "minOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}